

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t intersect_uint16(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB,uint16_t *out)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  int32_t iVar4;
  uint16_t *puVar5;
  
  iVar4 = 0;
  if (lenB != 0 && lenA != 0) {
    puVar1 = A + lenA;
    puVar2 = B + lenB;
    puVar5 = out;
    do {
      while (uVar3 = *A, *B <= uVar3) {
        while (*B < uVar3) {
          B = B + 1;
          if (B == puVar2) goto LAB_00102312;
        }
        if (uVar3 != *B) break;
        *puVar5 = uVar3;
        puVar5 = puVar5 + 1;
        A = A + 1;
        if ((A == puVar1) || (B = B + 1, B == puVar2)) goto LAB_00102312;
      }
      A = A + 1;
    } while (A != puVar1);
LAB_00102312:
    iVar4 = (int32_t)((ulong)((long)puVar5 - (long)out) >> 1);
  }
  return iVar4;
}

Assistant:

int32_t intersect_uint16(const uint16_t *A, const size_t lenA,
                         const uint16_t *B, const size_t lenB, uint16_t *out) {
    const uint16_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (int32_t)(out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (int32_t)(out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (int32_t)(out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    return (int32_t)(out - initout);  // NOTREACHED
}